

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

void __thiscall masc::polygon::c_ply::destroy(c_ply *this)

{
  pointer pppVar1;
  int iVar2;
  undefined4 extraout_var;
  ply_vertex *ppVar4;
  ply_vertex *ppVar3;
  
  if (this->head != (ply_vertex *)0x0) {
    ppVar4 = this->head;
    do {
      iVar2 = (*ppVar4->_vptr_ply_vertex[3])(ppVar4);
      ppVar3 = (ply_vertex *)CONCAT44(extraout_var,iVar2);
      (*ppVar4->_vptr_ply_vertex[1])(ppVar4);
      if (ppVar3 == (ply_vertex *)0x0) break;
      ppVar4 = ppVar3;
    } while (ppVar3 != this->head);
    this->head = (ply_vertex *)0x0;
    this->tail = (ply_vertex *)0x0;
    pppVar1 = (this->all).
              super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->all).
        super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != pppVar1) {
      (this->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = pppVar1;
    }
  }
  return;
}

Assistant:

void c_ply::destroy()
{
    if( head==NULL ) return;
    ply_vertex* ptr=head;
    do{
        ply_vertex * n=ptr->getNext();
        delete ptr;
        ptr=n;
    }
    while( ptr!=head && ptr!=NULL);
    head=tail=NULL;

    all.clear();
}